

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O2

string * __thiscall
efsw::FileInfo::linksTo_abi_cxx11_(string *__return_storage_ptr__,FileInfo *this)

{
  char *__ptr;
  allocator local_12;
  allocator local_11;
  
  if (((this->Permissions & 0xf000) == 0xa000) &&
     (__ptr = realpath((this->Filepath)._M_dataplus._M_p,(char *)0x0), __ptr != (char *)0x0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,__ptr,&local_11);
    free(__ptr);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_12);
  return __return_storage_ptr__;
}

Assistant:

std::string FileInfo::linksTo() {
#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	if ( isLink() ) {
		char* ch = realpath( Filepath.c_str(), NULL );

		if ( NULL != ch ) {
			std::string tstr( ch );

			free( ch );

			return tstr;
		}
	}
#endif
	return std::string( "" );
}